

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O3

void __thiscall
chrono::viper::ViperLowerArm::ViperLowerArm
          (ViperLowerArm *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int *side)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char *pcVar2;
  shared_ptr<chrono::ChMaterialSurface> local_28;
  
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var1 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ViperPart::ViperPart(&this->super_ViperPart,name,rel_pos,&local_28,false);
  if (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ViperPart)._vptr_ViperPart = (_func_int **)&PTR__ViperPart_0017ef88;
  if (*side == 0) {
    pcVar2 = "viper_L_bt_sus";
  }
  else {
    if (*side != 1) goto LAB_0015960e;
    pcVar2 = "viper_R_bt_sus";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ViperPart).m_mesh_name,0,
             (char *)(this->super_ViperPart).m_mesh_name._M_string_length,(ulong)pcVar2);
LAB_0015960e:
  (this->super_ViperPart).m_color.R = 0.7;
  (this->super_ViperPart).m_color.G = 0.4;
  (this->super_ViperPart).m_color.B = 0.4;
  ViperPart::CalcMassProperties(&this->super_ViperPart,4500.0);
  return;
}

Assistant:

ViperLowerArm::ViperLowerArm(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             const int& side)
    : ViperPart(name, rel_pos, mat, false) {
    if (side == 0) {
        m_mesh_name = "viper_L_bt_sus";
    } else if (side == 1) {
        m_mesh_name = "viper_R_bt_sus";
    }

    m_color = ChColor(0.7f, 0.4f, 0.4f);
    CalcMassProperties(4500);
}